

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Dsd(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Gia_Man_t *pNew;
  char *pcVar2;
  bool bVar3;
  uint local_38;
  int fUpdateLevel;
  int fVerbose;
  int c;
  Gia_Man_t *pTemp;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  local_38 = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    do {
      iVar1 = Extra_UtilGetopt(argc,argv,"lvh");
      if (iVar1 == -1) {
        bVar3 = pAbc->pGia != (Gia_Man_t *)0x0;
        if (bVar3) {
          pNew = Gia_ManCollapseTest(pAbc->pGia,local_38);
          Abc_FrameUpdateGia(pAbc,pNew);
        }
        else {
          Abc_Print(-1,"Abc_CommandAbc9Dsd(): There is no AIG.\n");
        }
        pAbc_local._4_4_ = (uint)!bVar3;
        return pAbc_local._4_4_;
      }
      if (iVar1 == 0x68) goto LAB_002a780a;
    } while (iVar1 == 0x6c);
    if (iVar1 != 0x76) break;
    local_38 = local_38 ^ 1;
  }
LAB_002a780a:
  Abc_Print(-2,"usage: &dsd [-vh]\n");
  Abc_Print(-2,"\t         performs DSD-based collapsing\n");
  pcVar2 = "no";
  if (local_38 != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar2);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandAbc9Dsd( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManCollapseTest( Gia_Man_t * p, int fVerbose );
    Gia_Man_t * pTemp;
    int c, fVerbose = 0;
    int fUpdateLevel = 1;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "lvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'l':
            fUpdateLevel ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Dsd(): There is no AIG.\n" );
        return 1;
    }
    pTemp = Gia_ManCollapseTest( pAbc->pGia, fVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &dsd [-vh]\n" );
    Abc_Print( -2, "\t         performs DSD-based collapsing\n" );
//    Abc_Print( -2, "\t-l     : toggle level update during rewriting [default = %s]\n", fUpdateLevel? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}